

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

char * voc_read_oops(voccxdef *ctx,char *oopsbuf,size_t oopsbuflen,char *unknown_word)

{
  char cVar1;
  short sVar2;
  int iVar3;
  ushort **ppuVar4;
  __int32_t **pp_Var5;
  size_t sVar6;
  char *pcVar7;
  byte *pbVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  
  vocerr(ctx,2,"I don\'t know the word \"%s\".",oopsbuflen);
  iVar3 = vocread(ctx,0xffff,0xffff,oopsbuf,0x80,1);
  pbVar8 = (byte *)oopsbuf;
  if (iVar3 == 0) {
    while( true ) {
      bVar10 = *pbVar8;
      uVar11 = (ulong)bVar10;
      if (uVar11 == 0) break;
      if ((-1 < (char)bVar10) &&
         (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + uVar11 * 2 + 1) & 1) != 0)) {
        pp_Var5 = __ctype_tolower_loc();
        bVar10 = *(byte *)(*pp_Var5 + uVar11);
      }
      *pbVar8 = bVar10;
      pbVar8 = pbVar8 + 1;
    }
    while ((sVar2 = *(short *)oopsbuf, -1 < (long)(char)sVar2 &&
           (ppuVar4 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar4 + (long)(char)sVar2 * 2 + 1) & 0x20) != 0))) {
      oopsbuf = (char *)((long)oopsbuf + 1);
    }
    sVar6 = strlen(oopsbuf);
    if (sVar6 < 6) {
      if (sVar6 < 3) {
        return (char *)0x0;
      }
    }
    else {
      lVar9 = 5;
      iVar3 = bcmp(oopsbuf,"oops ",5);
      if (iVar3 == 0) goto LAB_001f6561;
      lVar9 = 5;
      iVar3 = bcmp(oopsbuf,"oops,",5);
      if (iVar3 == 0) goto LAB_001f6561;
    }
    lVar9 = 2;
    if ((*(short *)oopsbuf == 0x206f) || (*(short *)oopsbuf == 0x2c6f)) {
LAB_001f6561:
      pcVar7 = (char *)((long)oopsbuf + lVar9);
      while( true ) {
        cVar1 = *pcVar7;
        if ((long)cVar1 < 0) {
          return pcVar7;
        }
        ppuVar4 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0) break;
        pcVar7 = pcVar7 + 1;
      }
      return pcVar7;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *voc_read_oops(voccxdef *ctx, char *oopsbuf, size_t oopsbuflen,
                           const char *unknown_word)
{
    char *p;
    
    /* display the error */
    vocerr(ctx, VOCERR(2), "I don't know the word \"%s\".", unknown_word);

    /* read a new command */
    if (vocread(ctx, MCMONINV, MCMONINV,
                oopsbuf, (int)oopsbuflen, 1) == VOCREAD_REDO)
    {
        /* 
         *   we've already decided it's not an OOPS input - return null to
         *   indicate to the caller that we have a new command 
         */
        return 0;
    }

    /* lower-case the string */
    for (p = oopsbuf ; *p != '\0' ; ++p)
        *p = (vocisupper(*p) ? tolower(*p) : *p);

    /* skip leading spaces */
    for (p = oopsbuf ; vocisspace(*p) ; ++p) ;

    /* 
     *   See if they are saying "oops".  Allow "oops" or simply "o",
     *   followed by either a space or a comma.  
     */
    if ((strlen(p) > 5 && memcmp(p, "oops ", 5) == 0)
        || (strlen(p) > 5 && memcmp(p, "oops,", 5) == 0))
    {
        /* we found "OOPS" - move to the next character */
        p += 5;
    }
    else if ((strlen(p) > 2 && memcmp(p, "o ", 2) == 0)
             || (strlen(p) > 2 && memcmp(p, "o,", 2) == 0))
    {
        /* we found "O" - move to the next character */
        p += 2;
    }
    else
    {
        /* 
         *   we didn't find any form of "OOPS" response - return null to
         *   indicate to the caller that the player entered a new command 
         */
        return 0;
    }

    /* skip spaces before the replacement text */
    for ( ; vocisspace(*p) ; ++p) ;

    /* return a pointer to the start of the replacement text */
    return p;
}